

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<0ul>>
               (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
                *t,ct_variable<0UL> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_variable<0UL> *rhs;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_00;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_01;
  ct_variable<0UL> *rhs_02;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_03;
  ct_variable<0UL> *rhs_04;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_05;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
  local_51 [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  local_4b [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
  local_45 [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_3f [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
  local_39;
  ct_variable<1UL> local_35 [4];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
  local_31 [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_2b;
  double local_28;
  double u2_local;
  double t2_local;
  ct_variable<0UL> *u_local;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *t_local;
  
  local_28 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = (ct_variable<0UL> *)t;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
                              *)u_local);
  poVar1 = std::operator<<(poVar1,", RHS: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_variable<0UL> *)t2_local);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator+
            ((type *)u_local,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
              *)t2_local,rhs);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>>
            (&local_2b,u2_local + local_28);
  viennamath::operator+((type *)t2_local,u_local,rhs_00);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>
            (local_31,local_28 + u2_local);
  viennamath::operator-
            ((ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
              *)u_local,(ct_variable<0UL> *)t2_local);
  evaluations_test<viennamath::ct_variable<1ul>>(local_35,u2_local - local_28);
  viennamath::operator-((type *)t2_local,u_local,rhs_01);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>
            (&local_39,local_28 - u2_local);
  viennamath::operator*
            ((type *)u_local,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
              *)t2_local,rhs_02);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (local_3f,u2_local * local_28);
  viennamath::operator*((type *)t2_local,u_local,rhs_03);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>
            (local_45,local_28 * u2_local);
  viennamath::operator/
            ((type *)u_local,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
              *)t2_local,rhs_04);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>
            (local_4b,u2_local / local_28);
  viennamath::operator/((type *)t2_local,u_local,rhs_05);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>
            (local_51,local_28 / u2_local);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}